

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_codes_writer.c
# Opt level: O1

void aom_write_primitive_refsubexpfin(aom_writer *w,uint16_t n,uint16_t k,uint16_t ref,uint16_t v)

{
  bool bVar1;
  uint uVar2;
  undefined6 in_register_0000000a;
  uint uVar3;
  uint uVar4;
  undefined6 in_register_00000032;
  uint uVar5;
  int iVar6;
  int i;
  int iVar7;
  od_ec_enc *enc;
  int iVar8;
  int iVar9;
  uint local_40;
  
  uVar3 = (uint)CONCAT62(in_register_00000032,n);
  iVar6 = (int)CONCAT62(in_register_0000000a,ref);
  uVar4 = (uint)v;
  if (uVar3 < (uint)(iVar6 * 2)) {
    uVar2 = (uVar3 - 1) - iVar6;
    uVar4 = (uVar3 - 1) - uVar4;
    if ((uVar2 & 0xffff) * 2 < (uVar4 & 0xffff)) goto LAB_002a2c06;
    if ((ushort)uVar4 < (ushort)uVar2) {
      uVar4 = (uVar2 - uVar4) * 2 - 1;
      goto LAB_002a2c06;
    }
    iVar6 = uVar4 - uVar2;
  }
  else {
    if ((uint)(iVar6 * 2) < (uint)v) goto LAB_002a2c06;
    if (v < ref) {
      uVar4 = (iVar6 - uVar4) * 2 - 1;
      goto LAB_002a2c06;
    }
    iVar6 = uVar4 - iVar6;
  }
  uVar4 = iVar6 * 2;
LAB_002a2c06:
  enc = &w->ec;
  uVar4 = uVar4 & 0xffff;
  iVar6 = 0;
  iVar7 = 0;
  do {
    local_40 = (uint)k;
    uVar2 = (k - 1) + iVar7;
    if (iVar7 == 0) {
      uVar2 = local_40;
    }
    if ((3 << ((byte)uVar2 & 0x1f)) + iVar6 < (int)uVar3) {
      iVar8 = (1 << ((byte)uVar2 & 0x1f)) + iVar6;
      od_ec_encode_bool_q15(enc,(uint)(iVar8 <= (int)uVar4),0x4000);
      if ((int)uVar4 < iVar8) {
        if (0 < (int)uVar2) {
          iVar8 = iVar7 + (uint)(iVar7 == 0) + local_40;
          do {
            od_ec_encode_bool_q15
                      (enc,(uint)((uVar4 - iVar6 >> (iVar8 - 2U & 0x1f) & 1) != 0),0x4000);
            iVar8 = iVar8 + -1;
          } while (1 < iVar8);
        }
        bVar1 = false;
      }
      else {
        iVar7 = iVar7 + 1;
        bVar1 = true;
        iVar6 = iVar8;
      }
    }
    else if ((ushort)(uVar3 - iVar6) < 2) {
      bVar1 = false;
    }
    else {
      uVar5 = uVar3 - iVar6 & 0xffff;
      uVar2 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> uVar2 == 0; uVar2 = uVar2 - 1) {
        }
      }
      iVar8 = (2 << ((byte)uVar2 & 0x1f)) - uVar5;
      uVar5 = uVar4 - iVar6 & 0xffff;
      if ((int)uVar5 < iVar8) {
        if ((uVar2 ^ 0x1f) == 0x1f) {
          bVar1 = false;
          goto LAB_002a2dbf;
        }
        iVar8 = uVar2 + 1;
        do {
          od_ec_encode_bool_q15(enc,(uint)((uVar5 >> (iVar8 - 2U & 0x1f) & 1) != 0),0x4000);
          iVar8 = iVar8 + -1;
        } while (1 < iVar8);
      }
      else {
        if ((uVar2 ^ 0x1f) != 0x1f) {
          iVar9 = uVar2 + 1;
          do {
            od_ec_encode_bool_q15
                      (enc,(uint)(((uint)(((int)(uVar5 - iVar8) >> 1) + iVar8) >>
                                   (iVar9 - 2U & 0x1f) & 1) != 0),0x4000);
            iVar9 = iVar9 + -1;
          } while (1 < iVar9);
        }
        od_ec_encode_bool_q15(enc,uVar5 - iVar8 & 1,0x4000);
      }
      bVar1 = false;
    }
LAB_002a2dbf:
    if (!bVar1) {
      return;
    }
  } while( true );
}

Assistant:

void aom_write_primitive_refsubexpfin(aom_writer *w, uint16_t n, uint16_t k,
                                      uint16_t ref, uint16_t v) {
  write_primitive_subexpfin(w, n, k, recenter_finite_nonneg(n, ref, v));
}